

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_alloc.c
# Opt level: O0

void * lj_alloc_malloc(void *msp,size_t nsize)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  size_t sVar9;
  void *pvVar10;
  byte bVar11;
  ulong local_100;
  mchunkptr r_2;
  mchunkptr p_3;
  size_t rsize_2;
  size_t dvs;
  mchunkptr r_1;
  mchunkptr p_2;
  size_t rsize_1;
  mchunkptr F_2;
  mchunkptr B;
  bindex_t I;
  mchunkptr DV;
  size_t DVS;
  mchunkptr F_1;
  bindex_t i;
  binmap_t leftbits;
  size_t rsize;
  mchunkptr r;
  mchunkptr p_1;
  mchunkptr b_1;
  mchunkptr F;
  mchunkptr p;
  mchunkptr b;
  binmap_t smallbits;
  bindex_t idx;
  size_t nb;
  void *mem;
  mstate ms;
  size_t nsize_local;
  void *msp_local;
  
  if (nsize < 0xf1) {
    if (nsize < 0x17) {
      local_100 = 0x20;
    }
    else {
      local_100 = nsize + 0xf & 0xfffffffffffffff8;
    }
    idx = local_100;
    bVar11 = (byte)(local_100 >> 3);
    uVar3 = *msp >> (bVar11 & 0x1f);
    if ((uVar3 & 3) != 0) {
      lVar4 = (ulong)((uVar3 ^ 0xffffffff) & 1) + (local_100 >> 3);
      lVar5 = (long)msp + lVar4 * 0x10 + 0x38;
      lVar1 = *(long *)(lVar5 + 0x10);
      lVar7 = *(long *)(lVar1 + 0x10);
      if (lVar5 == lVar7) {
        *(uint *)msp = (1 << ((byte)lVar4 & 0x1f) ^ 0xffffffffU) & *msp;
      }
      else {
        *(long *)(lVar5 + 0x10) = lVar7;
        *(long *)(lVar7 + 0x18) = lVar5;
      }
      *(ulong *)(lVar1 + 8) = lVar4 * 8 | 3;
      *(ulong *)(lVar1 + 8 + lVar4 * 8) = *(ulong *)(lVar1 + 8 + lVar4 * 8) | 1;
      return (void *)(lVar1 + 0x10);
    }
    if (local_100 <= *(ulong *)((long)msp + 8)) goto LAB_00160788;
    if (uVar3 != 0) {
      uVar2 = 0;
      for (uVar3 = uVar3 << (bVar11 & 0x1f) &
                   ((1 << (bVar11 & 0x1f)) << 1 | ((1 << (bVar11 & 0x1f)) << 1 ^ 0xffffffffU) + 1);
          (uVar3 & 1) == 0; uVar3 = uVar3 >> 1 | 0x80000000) {
        uVar2 = uVar2 + 1;
      }
      uVar8 = (ulong)uVar2;
      lVar4 = (long)msp + uVar8 * 0x10 + 0x38;
      lVar1 = *(long *)(lVar4 + 0x10);
      lVar7 = *(long *)(lVar1 + 0x10);
      if (lVar4 == lVar7) {
        *(uint *)msp = (1 << ((byte)uVar2 & 0x1f) ^ 0xffffffffU) & *msp;
      }
      else {
        *(long *)(lVar4 + 0x10) = lVar7;
        *(long *)(lVar7 + 0x18) = lVar4;
      }
      uVar6 = uVar8 * 8 - local_100;
      if (uVar6 < 0x20) {
        *(ulong *)(lVar1 + 8) = uVar8 << 3 | 3;
        *(ulong *)(lVar1 + 8 + uVar8 * 8) = *(ulong *)(lVar1 + 8 + uVar8 * 8) | 1;
      }
      else {
        *(ulong *)(lVar1 + 8) = local_100 | 3;
        lVar7 = lVar1 + local_100;
        *(ulong *)(lVar7 + 8) = uVar6 | 1;
        *(ulong *)(lVar7 + uVar6) = uVar6;
        if (*(ulong *)((long)msp + 8) != 0) {
          lVar4 = *(long *)((long)msp + 0x18);
          uVar8 = *(ulong *)((long)msp + 8) >> 3;
          sVar9 = (long)msp + uVar8 * 0x10 + 0x38;
          bVar11 = (byte)uVar8;
          if ((*msp & 1 << (bVar11 & 0x1f)) == 0) {
            *(uint *)msp = 1 << (bVar11 & 0x1f) | *msp;
            rsize_1 = sVar9;
          }
          else {
            rsize_1 = *(size_t *)(sVar9 + 0x10);
          }
          *(long *)(sVar9 + 0x10) = lVar4;
          *(long *)(rsize_1 + 0x18) = lVar4;
          *(size_t *)(lVar4 + 0x10) = rsize_1;
          *(size_t *)(lVar4 + 0x18) = sVar9;
        }
        *(ulong *)((long)msp + 8) = uVar6;
        *(long *)((long)msp + 0x18) = lVar7;
      }
      return (void *)(lVar1 + 0x10);
    }
    if (*(int *)((long)msp + 4) == 0) goto LAB_00160788;
    pvVar10 = tmalloc_small((mstate)msp,local_100);
  }
  else {
    if (0xffffffffffffff7f < nsize) {
      idx = 0xffffffffffffffff;
      goto LAB_00160788;
    }
    idx = nsize + 0xf & 0xfffffffffffffff8;
    if (*(int *)((long)msp + 4) == 0) goto LAB_00160788;
    pvVar10 = tmalloc_large((mstate)msp,idx);
  }
  if (pvVar10 != (void *)0x0) {
    return pvVar10;
  }
LAB_00160788:
  if (*(ulong *)((long)msp + 8) < idx) {
    if (idx < *(ulong *)((long)msp + 0x10)) {
      uVar8 = *(long *)((long)msp + 0x10) - idx;
      *(ulong *)((long)msp + 0x10) = uVar8;
      lVar1 = *(long *)((long)msp + 0x20);
      *(bindex_t *)((long)msp + 0x20) = lVar1 + idx;
      *(ulong *)(lVar1 + idx + 8) = uVar8 | 1;
      *(bindex_t *)(lVar1 + 8) = idx | 3;
      msp_local = (void *)(lVar1 + 0x10);
    }
    else {
      msp_local = alloc_sys((mstate)msp,idx);
    }
  }
  else {
    uVar8 = *(long *)((long)msp + 8) - idx;
    lVar1 = *(long *)((long)msp + 0x18);
    if (uVar8 < 0x20) {
      uVar8 = *(ulong *)((long)msp + 8);
      *(undefined8 *)((long)msp + 8) = 0;
      *(undefined8 *)((long)msp + 0x18) = 0;
      *(ulong *)(lVar1 + 8) = uVar8 | 3;
      *(ulong *)(lVar1 + 8 + uVar8) = *(ulong *)(lVar1 + 8 + uVar8) | 1;
    }
    else {
      lVar7 = lVar1 + idx;
      *(long *)((long)msp + 0x18) = lVar7;
      *(ulong *)((long)msp + 8) = uVar8;
      *(ulong *)(lVar7 + 8) = uVar8 | 1;
      *(ulong *)(lVar7 + uVar8) = uVar8;
      *(bindex_t *)(lVar1 + 8) = idx | 3;
    }
    msp_local = (void *)(lVar1 + 0x10);
  }
  return msp_local;
}

Assistant:

static LJ_NOINLINE void *lj_alloc_malloc(void *msp, size_t nsize)
{
  mstate ms = (mstate)msp;
  void *mem;
  size_t nb;
  if (nsize <= MAX_SMALL_REQUEST) {
    bindex_t idx;
    binmap_t smallbits;
    nb = (nsize < MIN_REQUEST)? MIN_CHUNK_SIZE : pad_request(nsize);
    idx = small_index(nb);
    smallbits = ms->smallmap >> idx;

    if ((smallbits & 0x3U) != 0) { /* Remainderless fit to a smallbin. */
      mchunkptr b, p;
      idx += ~smallbits & 1;       /* Uses next bin if idx empty */
      b = smallbin_at(ms, idx);
      p = b->fd;
      unlink_first_small_chunk(ms, b, p, idx);
      set_inuse_and_pinuse(ms, p, small_index2size(idx));
      mem = chunk2mem(p);
      return mem;
    } else if (nb > ms->dvsize) {
      if (smallbits != 0) { /* Use chunk in next nonempty smallbin */
	mchunkptr b, p, r;
	size_t rsize;
	binmap_t leftbits = (smallbits << idx) & left_bits(idx2bit(idx));
	bindex_t i = lj_ffs(leftbits);
	b = smallbin_at(ms, i);
	p = b->fd;
	unlink_first_small_chunk(ms, b, p, i);
	rsize = small_index2size(i) - nb;
	/* Fit here cannot be remainderless if 4byte sizes */
	if (SIZE_T_SIZE != 4 && rsize < MIN_CHUNK_SIZE) {
	  set_inuse_and_pinuse(ms, p, small_index2size(i));
	} else {
	  set_size_and_pinuse_of_inuse_chunk(ms, p, nb);
	  r = chunk_plus_offset(p, nb);
	  set_size_and_pinuse_of_free_chunk(r, rsize);
	  replace_dv(ms, r, rsize);
	}
	mem = chunk2mem(p);
	return mem;
      } else if (ms->treemap != 0 && (mem = tmalloc_small(ms, nb)) != 0) {
	return mem;
      }
    }
  } else if (nsize >= MAX_REQUEST) {
    nb = MAX_SIZE_T; /* Too big to allocate. Force failure (in sys alloc) */
  } else {
    nb = pad_request(nsize);
    if (ms->treemap != 0 && (mem = tmalloc_large(ms, nb)) != 0) {
      return mem;
    }
  }

  if (nb <= ms->dvsize) {
    size_t rsize = ms->dvsize - nb;
    mchunkptr p = ms->dv;
    if (rsize >= MIN_CHUNK_SIZE) { /* split dv */
      mchunkptr r = ms->dv = chunk_plus_offset(p, nb);
      ms->dvsize = rsize;
      set_size_and_pinuse_of_free_chunk(r, rsize);
      set_size_and_pinuse_of_inuse_chunk(ms, p, nb);
    } else { /* exhaust dv */
      size_t dvs = ms->dvsize;
      ms->dvsize = 0;
      ms->dv = 0;
      set_inuse_and_pinuse(ms, p, dvs);
    }
    mem = chunk2mem(p);
    return mem;
  } else if (nb < ms->topsize) { /* Split top */
    size_t rsize = ms->topsize -= nb;
    mchunkptr p = ms->top;
    mchunkptr r = ms->top = chunk_plus_offset(p, nb);
    r->head = rsize | PINUSE_BIT;
    set_size_and_pinuse_of_inuse_chunk(ms, p, nb);
    mem = chunk2mem(p);
    return mem;
  }
  return alloc_sys(ms, nb);
}